

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_get_tile_size(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  _Bool _Var2;
  uint *in_RSI;
  long in_RDI;
  int tile_height;
  int tile_width;
  AV1_COMMON *cm;
  FrameWorkerData *frame_worker_data;
  AVxWorker *worker;
  uint *tile_size;
  long *local_58;
  int local_40;
  int local_3c;
  AV1_COMMON *local_38;
  long *local_30;
  long local_28;
  int *local_20;
  aom_codec_err_t local_4;
  
  uVar1 = *in_RSI;
  if (uVar1 < 0x29) {
    local_58 = (long *)((long)(int)uVar1 + *(long *)(in_RSI + 4));
    *in_RSI = uVar1 + 8;
  }
  else {
    local_58 = *(long **)(in_RSI + 2);
    *(long **)(in_RSI + 2) = local_58 + 1;
  }
  local_20 = (int *)*local_58;
  local_28 = *(long *)(in_RDI + 0x69f0);
  if (local_20 == (int *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else if (local_28 == 0) {
    local_4 = AOM_CODEC_ERROR;
  }
  else {
    local_30 = *(long **)(local_28 + 0x20);
    local_38 = (AV1_COMMON *)(*local_30 + 0x3b60);
    _Var2 = av1_get_uniform_tile_size(local_38,&local_3c,&local_40);
    if (_Var2) {
      *local_20 = local_3c * 0x40000 + local_40 * 4;
      local_4 = AOM_CODEC_OK;
    }
    else {
      local_4 = AOM_CODEC_CORRUPT_FRAME;
    }
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_tile_size(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  unsigned int *const tile_size = va_arg(args, unsigned int *);
  AVxWorker *const worker = ctx->frame_worker;

  if (tile_size) {
    if (worker) {
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      const AV1_COMMON *const cm = &frame_worker_data->pbi->common;
      int tile_width, tile_height;
      if (!av1_get_uniform_tile_size(cm, &tile_width, &tile_height)) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      *tile_size = ((tile_width * MI_SIZE) << 16) + tile_height * MI_SIZE;
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }
  return AOM_CODEC_INVALID_PARAM;
}